

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_ATE_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  switch(val) {
  case 1:
    pcVar2 = "DW_ATE_address";
    break;
  case 2:
    pcVar2 = "DW_ATE_boolean";
    break;
  case 3:
    pcVar2 = "DW_ATE_complex_float";
    break;
  case 4:
    pcVar2 = "DW_ATE_float";
    break;
  case 5:
    pcVar2 = "DW_ATE_signed";
    break;
  case 6:
    pcVar2 = "DW_ATE_signed_char";
    break;
  case 7:
    pcVar2 = "DW_ATE_unsigned";
    break;
  case 8:
    pcVar2 = "DW_ATE_unsigned_char";
    break;
  case 9:
    pcVar2 = "DW_ATE_imaginary_float";
    break;
  case 10:
    pcVar2 = "DW_ATE_packed_decimal";
    break;
  case 0xb:
    pcVar2 = "DW_ATE_numeric_string";
    break;
  case 0xc:
    pcVar2 = "DW_ATE_edited";
    break;
  case 0xd:
    pcVar2 = "DW_ATE_signed_fixed";
    break;
  case 0xe:
    pcVar2 = "DW_ATE_unsigned_fixed";
    break;
  case 0xf:
    pcVar2 = "DW_ATE_decimal_float";
    break;
  case 0x10:
    pcVar2 = "DW_ATE_UTF";
    break;
  case 0x11:
    pcVar2 = "DW_ATE_UCS";
    break;
  case 0x12:
    pcVar2 = "DW_ATE_ASCII";
    break;
  default:
    iVar1 = -1;
    switch(val) {
    case 0x80:
      pcVar2 = "DW_ATE_ALTIUM_fract";
      break;
    case 0x81:
      pcVar2 = "DW_ATE_ALTIUM_accum";
      break;
    case 0x82:
      pcVar2 = "DW_ATE_HP_float128";
      break;
    case 0x83:
      pcVar2 = "DW_ATE_HP_complex_float128";
      break;
    case 0x84:
      pcVar2 = "DW_ATE_HP_floathpintel";
      break;
    case 0x85:
      pcVar2 = "DW_ATE_HP_imaginary_float80";
      break;
    case 0x86:
      pcVar2 = "DW_ATE_HP_imaginary_float128";
      break;
    case 0x87:
      goto switchD_0017db0e_caseD_87;
    case 0x88:
      pcVar2 = "DW_ATE_HP_VAX_float";
      break;
    case 0x89:
      pcVar2 = "DW_ATE_HP_VAX_float_d";
      break;
    case 0x8a:
      pcVar2 = "DW_ATE_HP_packed_decimal";
      break;
    case 0x8b:
      pcVar2 = "DW_ATE_HP_zoned_decimal";
      break;
    case 0x8c:
      pcVar2 = "DW_ATE_HP_edited";
      break;
    case 0x8d:
      pcVar2 = "DW_ATE_HP_signed_fixed";
      break;
    case 0x8e:
      pcVar2 = "DW_ATE_HP_unsigned_fixed";
      break;
    case 0x8f:
      pcVar2 = "DW_ATE_HP_VAX_complex_float";
      break;
    case 0x90:
      pcVar2 = "DW_ATE_HP_VAX_complex_float_d";
      break;
    case 0x91:
      pcVar2 = "DW_ATE_SUN_interval_float";
      break;
    case 0x92:
      pcVar2 = "DW_ATE_SUN_imaginary_float";
      break;
    default:
      if (val != 0xff) {
        return -1;
      }
      pcVar2 = "DW_ATE_hi_user";
    }
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_0017db0e_caseD_87:
  return iVar1;
}

Assistant:

int
dwarf_get_ATE_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ATE_address:
        *s_out = "DW_ATE_address";
        return DW_DLV_OK;
    case DW_ATE_boolean:
        *s_out = "DW_ATE_boolean";
        return DW_DLV_OK;
    case DW_ATE_complex_float:
        *s_out = "DW_ATE_complex_float";
        return DW_DLV_OK;
    case DW_ATE_float:
        *s_out = "DW_ATE_float";
        return DW_DLV_OK;
    case DW_ATE_signed:
        *s_out = "DW_ATE_signed";
        return DW_DLV_OK;
    case DW_ATE_signed_char:
        *s_out = "DW_ATE_signed_char";
        return DW_DLV_OK;
    case DW_ATE_unsigned:
        *s_out = "DW_ATE_unsigned";
        return DW_DLV_OK;
    case DW_ATE_unsigned_char:
        *s_out = "DW_ATE_unsigned_char";
        return DW_DLV_OK;
    case DW_ATE_imaginary_float:
        *s_out = "DW_ATE_imaginary_float";
        return DW_DLV_OK;
    case DW_ATE_packed_decimal:
        *s_out = "DW_ATE_packed_decimal";
        return DW_DLV_OK;
    case DW_ATE_numeric_string:
        *s_out = "DW_ATE_numeric_string";
        return DW_DLV_OK;
    case DW_ATE_edited:
        *s_out = "DW_ATE_edited";
        return DW_DLV_OK;
    case DW_ATE_signed_fixed:
        *s_out = "DW_ATE_signed_fixed";
        return DW_DLV_OK;
    case DW_ATE_unsigned_fixed:
        *s_out = "DW_ATE_unsigned_fixed";
        return DW_DLV_OK;
    case DW_ATE_decimal_float:
        *s_out = "DW_ATE_decimal_float";
        return DW_DLV_OK;
    case DW_ATE_UTF:
        *s_out = "DW_ATE_UTF";
        return DW_DLV_OK;
    case DW_ATE_UCS:
        *s_out = "DW_ATE_UCS";
        return DW_DLV_OK;
    case DW_ATE_ASCII:
        *s_out = "DW_ATE_ASCII";
        return DW_DLV_OK;
    case DW_ATE_ALTIUM_fract:
        *s_out = "DW_ATE_ALTIUM_fract";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x80. DW_ATE_lo_user */
    /*  Skipping alternate spelling of value
        0x80. DW_ATE_HP_float80 */
    case DW_ATE_ALTIUM_accum:
        *s_out = "DW_ATE_ALTIUM_accum";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x81. DW_ATE_HP_complex_float80 */
    case DW_ATE_HP_float128:
        *s_out = "DW_ATE_HP_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_complex_float128:
        *s_out = "DW_ATE_HP_complex_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_floathpintel:
        *s_out = "DW_ATE_HP_floathpintel";
        return DW_DLV_OK;
    case DW_ATE_HP_imaginary_float80:
        *s_out = "DW_ATE_HP_imaginary_float80";
        return DW_DLV_OK;
    case DW_ATE_HP_imaginary_float128:
        *s_out = "DW_ATE_HP_imaginary_float128";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_float:
        *s_out = "DW_ATE_HP_VAX_float";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_float_d:
        *s_out = "DW_ATE_HP_VAX_float_d";
        return DW_DLV_OK;
    case DW_ATE_HP_packed_decimal:
        *s_out = "DW_ATE_HP_packed_decimal";
        return DW_DLV_OK;
    case DW_ATE_HP_zoned_decimal:
        *s_out = "DW_ATE_HP_zoned_decimal";
        return DW_DLV_OK;
    case DW_ATE_HP_edited:
        *s_out = "DW_ATE_HP_edited";
        return DW_DLV_OK;
    case DW_ATE_HP_signed_fixed:
        *s_out = "DW_ATE_HP_signed_fixed";
        return DW_DLV_OK;
    case DW_ATE_HP_unsigned_fixed:
        *s_out = "DW_ATE_HP_unsigned_fixed";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_complex_float:
        *s_out = "DW_ATE_HP_VAX_complex_float";
        return DW_DLV_OK;
    case DW_ATE_HP_VAX_complex_float_d:
        *s_out = "DW_ATE_HP_VAX_complex_float_d";
        return DW_DLV_OK;
    case DW_ATE_SUN_interval_float:
        *s_out = "DW_ATE_SUN_interval_float";
        return DW_DLV_OK;
    case DW_ATE_SUN_imaginary_float:
        *s_out = "DW_ATE_SUN_imaginary_float";
        return DW_DLV_OK;
    case DW_ATE_hi_user:
        *s_out = "DW_ATE_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}